

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O2

void __thiscall
HighsLp::deleteColsFromVectors
          (HighsLp *this,HighsInt *new_num_col,HighsIndexCollection *index_collection)

{
  pointer pHVar1;
  pointer pdVar2;
  pointer pHVar3;
  int iVar4;
  vector<double,_std::allocator<double>_> *this_00;
  int iVar5;
  long lVar6;
  HighsInt keep_to_col;
  HighsInt current_set_entry;
  HighsInt keep_from_col;
  HighsInt delete_to_col;
  HighsInt delete_from_col;
  HighsInt to_k;
  HighsInt from_k;
  HighsInt local_8c;
  int local_88;
  int local_84;
  HighsInt local_80;
  int local_7c;
  int local_78;
  HighsInt local_74;
  int local_70;
  int local_6c;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  vector<double,_std::allocator<double>_> *local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  HighsIndexCollection *local_38;
  
  local_38 = index_collection;
  limits(index_collection,&local_6c,&local_70);
  local_88 = this->num_col_;
  *new_num_col = local_88;
  if (local_6c <= local_70) {
    local_8c = -1;
    local_80 = 0;
    *new_num_col = 0;
    local_60 = &this->col_names_;
    local_40 = (this->col_names_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_48 = (this->col_names_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_68 = &this->integrality_;
    local_50 = (this->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    pHVar1 = (this->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_88 = local_88 + -1;
    this_00 = &this->col_upper_;
    iVar5 = local_6c;
    local_58 = this_00;
    do {
      iVar4 = local_88;
      if (local_70 < iVar5) break;
      updateOutInIndex(local_38,&local_74,&local_78,&local_7c,&local_8c,&local_80);
      if (iVar5 == local_6c) {
        *new_num_col = local_74;
      }
      this_00 = local_58;
      if (iVar4 <= local_78) break;
      local_84 = iVar5;
      for (lVar6 = (long)local_7c; lVar6 <= local_8c; lVar6 = lVar6 + 1) {
        pdVar2 = (this->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = *new_num_col;
        pdVar2[iVar5] = pdVar2[lVar6];
        pdVar2 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2[iVar5] = pdVar2[lVar6];
        pdVar2 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2[iVar5] = pdVar2[lVar6];
        if (local_48 != local_40) {
          std::__cxx11::string::_M_assign
                    ((string *)
                     ((local_60->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + iVar5));
          iVar5 = *new_num_col;
          this_00 = local_58;
        }
        if (local_50 != pHVar1) {
          pHVar3 = (local_68->super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pHVar3[iVar5] = pHVar3[lVar6];
        }
        *new_num_col = iVar5 + 1;
      }
      iVar5 = local_84 + 1;
    } while (local_8c < local_88);
    std::vector<double,_std::allocator<double>_>::resize(&this->col_cost_,(long)*new_num_col);
    std::vector<double,_std::allocator<double>_>::resize(&this->col_lower_,(long)*new_num_col);
    std::vector<double,_std::allocator<double>_>::resize(this_00,(long)*new_num_col);
    if (local_50 != pHVar1) {
      std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize(local_68,(long)*new_num_col);
    }
    if (local_48 != local_40) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(local_60,(long)*new_num_col);
    }
  }
  return;
}

Assistant:

void HighsLp::deleteColsFromVectors(
    HighsInt& new_num_col, const HighsIndexCollection& index_collection) {
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  // Initialise new_num_col in case none is removed due to from_k > to_k
  new_num_col = this->num_col_;
  if (from_k > to_k) return;

  HighsInt delete_from_col;
  HighsInt delete_to_col;
  HighsInt keep_from_col;
  HighsInt keep_to_col = -1;
  HighsInt current_set_entry = 0;

  HighsInt col_dim = this->num_col_;
  new_num_col = 0;
  bool have_names = (this->col_names_.size() != 0);
  bool have_integrality = (this->integrality_.size() != 0);
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, delete_from_col, delete_to_col,
                     keep_from_col, keep_to_col, current_set_entry);
    // Account for the initial columns being kept
    if (k == from_k) new_num_col = delete_from_col;
    if (delete_to_col >= col_dim - 1) break;
    assert(delete_to_col < col_dim);
    for (HighsInt col = keep_from_col; col <= keep_to_col; col++) {
      this->col_cost_[new_num_col] = this->col_cost_[col];
      this->col_lower_[new_num_col] = this->col_lower_[col];
      this->col_upper_[new_num_col] = this->col_upper_[col];
      if (have_names) this->col_names_[new_num_col] = this->col_names_[col];
      if (have_integrality)
        this->integrality_[new_num_col] = this->integrality_[col];
      new_num_col++;
    }
    if (keep_to_col >= col_dim - 1) break;
  }
  this->col_cost_.resize(new_num_col);
  this->col_lower_.resize(new_num_col);
  this->col_upper_.resize(new_num_col);
  if (have_integrality) this->integrality_.resize(new_num_col);
  if (have_names) this->col_names_.resize(new_num_col);
}